

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O2

BinaryLocation __thiscall
wasm::Debug::LocationUpdater::getNewFuncEnd(LocationUpdater *this,BinaryLocation oldAddr)

{
  BinaryLocation BVar1;
  const_iterator cVar2;
  Function *local_20;
  Function *func;
  
  local_20 = FuncAddrMap::getEnd(&this->oldFuncAddrMap,oldAddr);
  if ((local_20 == (Function *)0x0) ||
     (cVar2 = std::
              _Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>,_std::allocator<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->newLocations->functions)._M_h,&local_20),
     cVar2.
     super__Node_iterator_base<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>,_false>
     ._M_cur == (__node_type *)0x0)) {
    return 0;
  }
  BVar1 = (local_20->funcLocation).end;
  if (BVar1 == oldAddr) {
    return *(BinaryLocation *)
            ((long)cVar2.
                   super__Node_iterator_base<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>,_false>
                   ._M_cur + 0x18);
  }
  if (BVar1 - 1 == oldAddr) {
    return *(BinaryLocation *)
            ((long)cVar2.
                   super__Node_iterator_base<std::pair<wasm::Function_*const,_wasm::BinaryLocations::FunctionLocations>,_false>
                   ._M_cur + 0x18) - 1;
  }
  handle_unreachable("invalid func end",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-debug.cpp"
                     ,0x23b);
}

Assistant:

BinaryLocation getNewFuncEnd(BinaryLocation oldAddr) const {
    if (auto* func = oldFuncAddrMap.getEnd(oldAddr)) {
      // The function might have been optimized away, check.
      auto iter = newLocations.functions.find(func);
      if (iter != newLocations.functions.end()) {
        auto oldLocations = func->funcLocation;
        auto newLocations = iter->second;
        if (oldAddr == oldLocations.end) {
          return newLocations.end;
        } else if (oldAddr == oldLocations.end - 1) {
          return newLocations.end - 1;
        } else {
          WASM_UNREACHABLE("invalid func end");
        }
      }
    }
    return 0;
  }